

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Inquire64(int g_a,int *type,int *ndim,int64_t *dims)

{
  long lVar1;
  long lVar2;
  int64_t *piVar3;
  Integer ttype;
  Integer nndim;
  Integer _ga_dims [7];
  int local_68 [2];
  long local_60;
  Integer local_58 [7];
  
  pnga_inquire((long)g_a,(Integer *)local_68,&local_60,local_58);
  lVar1 = 0;
  lVar2 = 0;
  if (0 < local_60) {
    lVar2 = local_60;
  }
  piVar3 = dims + local_60;
  for (; piVar3 = piVar3 + -1, lVar2 != lVar1; lVar1 = lVar1 + 1) {
    *piVar3 = local_58[lVar1];
  }
  *ndim = (int)local_60;
  *type = local_68[0];
  return;
}

Assistant:

void NGA_Inquire64(int g_a, int *type, int *ndim, int64_t dims[])
{
     Integer a=(Integer)g_a;
     Integer ttype, nndim;
     Integer _ga_dims[MAXDIM];
     wnga_inquire(a,&ttype, &nndim, _ga_dims);
     COPYF2C_64(_ga_dims, dims,nndim);  
     *ndim = (int)nndim;
     *type = (int)ttype;
}